

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O2

void duckdb::DuckDBExtensionsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  _func_int **pp_Var3;
  _func_int **__n;
  _func_int **pp_Var4;
  ulong index;
  Value local_160;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_120 [24];
  string local_108;
  string local_e8;
  LogicalType local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 200)) {
    for (index = 0; (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 200) && (index < 0x800))
        ; index = index + 1) {
      pvVar2 = vector<duckdb::ExtensionInformation,_true>::get<true>
                         ((vector<duckdb::ExtensionInformation,_true> *)(pGVar1 + 1),(size_type)__n)
      ;
      ::std::__cxx11::string::string((string *)&local_e8,(string *)pvVar2);
      Value::Value(&local_160,&local_e8);
      DataChunk::SetValue(output,0,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::~string((string *)&local_e8);
      Value::BOOLEAN(&local_160,pvVar2->loaded);
      DataChunk::SetValue(output,1,index,&local_160);
      Value::~Value(&local_160);
      Value::BOOLEAN(&local_160,pvVar2->installed);
      DataChunk::SetValue(output,2,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::string((string *)&local_108,(string *)&pvVar2->file_path);
      Value::Value(&local_160,&local_108);
      DataChunk::SetValue(output,3,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&pvVar2->description);
      Value::Value(&local_160,&local_50);
      DataChunk::SetValue(output,4,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::~string((string *)&local_50);
      LogicalType::LogicalType(&local_c8,VARCHAR);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                (local_120,
                 &(pvVar2->aliases).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
      Value::LIST(&local_160,&local_c8,(vector<duckdb::Value,_true> *)local_120);
      DataChunk::SetValue(output,5,index,&local_160);
      Value::~Value(&local_160);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_120);
      LogicalType::~LogicalType(&local_c8);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&pvVar2->extension_version);
      Value::Value(&local_160,&local_70);
      DataChunk::SetValue(output,6,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::~string((string *)&local_70);
      EnumUtil::ToString<duckdb::ExtensionInstallMode>(&local_90,pvVar2->install_mode);
      Value::Value(&local_160,&local_90);
      DataChunk::SetValue(output,7,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)&pvVar2->installed_from);
      Value::Value(&local_160,&local_b0);
      DataChunk::SetValue(output,8,index,&local_160);
      Value::~Value(&local_160);
      ::std::__cxx11::string::~string((string *)&local_b0);
      __n = (_func_int **)((long)pGVar1[4]._vptr_GlobalTableFunctionState + 1);
      pGVar1[4]._vptr_GlobalTableFunctionState = __n;
      pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBExtensionsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBExtensionsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		// return values:
		// extension_name LogicalType::VARCHAR
		output.SetValue(0, count, Value(entry.name));
		// loaded LogicalType::BOOLEAN
		output.SetValue(1, count, Value::BOOLEAN(entry.loaded));
		// installed LogicalType::BOOLEAN
		output.SetValue(2, count, Value::BOOLEAN(entry.installed));
		// install_path LogicalType::VARCHAR
		output.SetValue(3, count, Value(entry.file_path));
		// description LogicalType::VARCHAR
		output.SetValue(4, count, Value(entry.description));
		// aliases     LogicalType::LIST(LogicalType::VARCHAR)
		output.SetValue(5, count, Value::LIST(LogicalType::VARCHAR, entry.aliases));
		// extension version     LogicalType::LIST(LogicalType::VARCHAR)
		output.SetValue(6, count, Value(entry.extension_version));
		// installed_mode LogicalType::VARCHAR
		output.SetValue(7, count, EnumUtil::ToString(entry.install_mode));
		// installed_source LogicalType::VARCHAR
		output.SetValue(8, count, Value(entry.installed_from));

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}